

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_ledger.cpp
# Opt level: O3

int CfdFinalizeTxSerializeHashForLedger
              (void *handle,void *serialize_handle,int net_type,char *tx_hex_string,
              bool skip_witness,bool is_authorization,bool is_sha256,char **serialize_hex)

{
  pointer puVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  LedgerApi api;
  bool is_bitcoin;
  ConfidentialTransactionContext tx;
  allocator local_13a;
  bool local_139;
  string local_138;
  void *local_110;
  ByteData local_108;
  ConfidentialTransactionContext local_e8;
  
  local_110 = handle;
  cfd::Initialize();
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LedgerMetaData","");
  cfd::capi::CheckBuffer(serialize_handle,(string *)&local_e8);
  if ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
      local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction !=
      &local_e8.super_ConfidentialTransaction.vin_) {
    operator_delete(local_e8.super_ConfidentialTransaction.super_AbstractTransaction.
                    _vptr_AbstractTransaction);
  }
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e3709;
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xcd;
    local_e8.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e37b7;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (serialize_hex == (char **)0x0) {
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e3709;
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xd3;
    local_e8.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e37b7;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"serialize output is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. serialize output is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)serialize_handle + 0x10) != 0) {
    cfd::core::ByteData::ByteData(&local_108);
    local_139 = false;
    cfd::capi::ConvertNetType(net_type,&local_139);
    if (local_139 != true) {
      std::__cxx11::string::string((string *)&local_138,tx_hex_string,&local_13a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_e8,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      cfd::api::LedgerApi::Serialize
                ((ByteData *)&local_138,(LedgerApi *)&local_13a,&local_e8,
                 *(vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                   **)((long)serialize_handle + 0x10),skip_witness,is_authorization);
      puVar1 = local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_138._M_dataplus._M_p;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_138._M_string_length;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_138.field_2._M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if ((pointer)local_138._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
      if (is_sha256) {
        cfd::core::HashUtil::Sha256((ByteData256 *)&local_e8,&local_108);
        cfd::core::ByteData256::GetData((ByteData *)&local_138,(ByteData256 *)&local_e8);
        puVar1 = local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_138._M_dataplus._M_p;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_138._M_string_length;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_138.field_2._M_allocated_capacity
        ;
        local_138._M_dataplus._M_p = (pointer)0x0;
        local_138._M_string_length = 0;
        local_138.field_2._M_allocated_capacity = 0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1);
          if ((pointer)local_138._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_138._M_dataplus._M_p);
          }
        }
        if ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
            local_e8.super_ConfidentialTransaction.super_AbstractTransaction.
            _vptr_AbstractTransaction !=
            (vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)0x0
           ) {
          operator_delete(local_e8.super_ConfidentialTransaction.super_AbstractTransaction.
                          _vptr_AbstractTransaction);
        }
      }
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_e8,&local_108);
      pcVar3 = cfd::capi::CreateString((string *)&local_e8);
      *serialize_hex = pcVar3;
      if ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
          local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction
          != &local_e8.super_ConfidentialTransaction.vin_) {
        operator_delete(local_e8.super_ConfidentialTransaction.super_AbstractTransaction.
                        _vptr_AbstractTransaction);
      }
      if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Bitcoin serialize not implement.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5e3709;
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xdc;
  local_e8.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e37b7;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"buffer state is illegal.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. buffer state is illegal.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)&local_e8);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeTxSerializeHashForLedger(
    void* handle, void* serialize_handle, int net_type,
    const char* tx_hex_string, bool skip_witness, bool is_authorization,
    bool is_sha256, char** serialize_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(serialize_handle, kPrefixLedgerMetaData);

    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (serialize_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "serialize output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. serialize output is null.");
    }

    CfdCapiLedgerMetaData* buffer =
        static_cast<CfdCapiLedgerMetaData*>(serialize_handle);
    if (buffer->metadata_stack == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }

    ByteData serialize_data;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Bitcoin serialize not implement.");
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      LedgerApi api;
      serialize_data = api.Serialize(
          tx, *(buffer->metadata_stack), skip_witness, is_authorization);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (is_sha256) {
      ByteData256 hashed_data = HashUtil::Sha256(serialize_data);
      serialize_data = hashed_data.GetData();
    }
    *serialize_hex = CreateString(serialize_data.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}